

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv.c
# Opt level: O0

uint64_t SharpYUVUpdateY_C(uint16_t *ref,uint16_t *src,uint16_t *dst,int len)

{
  uint16_t uVar1;
  int iVar2;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int new_y;
  int diff_y;
  int i;
  uint64_t diff;
  undefined4 local_2c;
  undefined8 local_28;
  
  local_28 = 0;
  for (local_2c = 0; local_2c < in_ECX; local_2c = local_2c + 1) {
    iVar2 = (uint)*(ushort *)(in_RDI + (long)local_2c * 2) -
            (uint)*(ushort *)(in_RSI + (long)local_2c * 2);
    uVar1 = clip_y((uint)*(ushort *)(in_RDX + (long)local_2c * 2) + iVar2);
    *(uint16_t *)(in_RDX + (long)local_2c * 2) = uVar1;
    if (iVar2 < 1) {
      iVar2 = -iVar2;
    }
    local_28 = (long)iVar2 + local_28;
  }
  return local_28;
}

Assistant:

static uint64_t SharpYUVUpdateY_C(const uint16_t* ref, const uint16_t* src,
                                  uint16_t* dst, int len) {
  uint64_t diff = 0;
  int i;
  for (i = 0; i < len; ++i) {
    const int diff_y = ref[i] - src[i];
    const int new_y = (int)dst[i] + diff_y;
    dst[i] = clip_y(new_y);
    diff += (uint64_t)abs(diff_y);
  }
  return diff;
}